

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O2

void __thiscall pg::TSPMSolver::run(TSPMSolver *this)

{
  int node;
  Game *pGVar1;
  bitset *pbVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  ostream *poVar12;
  Error *this_00;
  int n;
  ulong uVar13;
  ulong uVar14;
  int i;
  ulong uVar15;
  char *pcVar16;
  int *piVar17;
  int n_1;
  long lVar18;
  ulong uVar19;
  uint winner;
  
  pGVar1 = (this->super_Solver).game;
  uVar19 = pGVar1->n_vertices;
  piVar17 = pGVar1->_priority;
  iVar5 = *(int *)((long)piVar17 + ((long)((uVar19 << 0x20) + -0x100000000) >> 0x1e));
  uVar6 = 2;
  if (0 < iVar5) {
    uVar6 = iVar5 + 1;
  }
  lVar18 = (long)(int)uVar6;
  uVar13 = uVar19 * lVar18;
  this->k = lVar18;
  piVar7 = (int *)operator_new__(-(ulong)(uVar13 >> 0x3e != 0) | uVar13 * 4);
  this->pms = piVar7;
  uVar15 = -(ulong)(uVar19 >> 0x3e != 0) | uVar19 * 4;
  piVar8 = (int *)operator_new__(uVar15);
  this->strategy = piVar8;
  uVar14 = 0xffffffffffffffff;
  if (-1 < (int)uVar6) {
    uVar14 = lVar18 * 4;
  }
  piVar9 = (int *)operator_new__(uVar14);
  this->counts = piVar9;
  piVar10 = (int *)operator_new__(uVar14);
  this->tmp = piVar10;
  piVar10 = (int *)operator_new__(uVar14);
  this->best = piVar10;
  piVar10 = (int *)operator_new__(uVar15);
  this->dirty = piVar10;
  piVar11 = (int *)operator_new__(uVar15);
  this->unstable = piVar11;
  for (uVar14 = 0; (~((long)uVar13 >> 0x3f) & uVar13) != uVar14; uVar14 = uVar14 + 1) {
    piVar7[uVar14] = 0;
  }
  uVar14 = ~((long)uVar19 >> 0x3f) & uVar19;
  for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
    piVar8[uVar13] = -1;
  }
  for (uVar13 = 0; (~((int)uVar6 >> 0x1f) & uVar6) != uVar13; uVar13 = uVar13 + 1) {
    piVar9[uVar13] = 0;
  }
  pbVar2 = (this->super_Solver).disabled;
  for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
    if ((pbVar2->_bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
      piVar9[piVar17[uVar13]] = piVar9[piVar17[uVar13]] + 1;
    }
  }
  for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
    piVar10[uVar13] = 0;
  }
  uVar19 = uVar19 & 0xffffffff;
  this->lift_attempt = 0;
  this->lift_count = 0;
  while( true ) {
    uVar19 = uVar19 - 1;
    uVar6 = (uint)uVar19;
    if ((int)uVar6 < 0) break;
    if ((((this->super_Solver).disabled)->_bits[(uVar6 & 0x7fffffff) >> 6] >> (uVar19 & 0x3f) & 1)
        == 0) {
      bVar4 = lift(this,uVar6,-1);
      if (bVar4) {
        pGVar1 = (this->super_Solver).game;
        piVar17 = pGVar1->_inedges + pGVar1->_firstins[uVar6 & 0x7fffffff];
        while( true ) {
          iVar5 = *piVar17;
          uVar14 = (ulong)iVar5;
          if (uVar14 == 0xffffffffffffffff) break;
          if ((((this->super_Solver).disabled)->_bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
            bVar4 = lift(this,iVar5,uVar6);
            if (bVar4) {
              todo_push(this,iVar5);
            }
          }
          piVar17 = piVar17 + 1;
        }
      }
    }
  }
  poVar12 = std::operator<<((this->super_Solver).logger,"main loop now");
  std::endl<char,std::char_traits<char>>(poVar12);
  lVar18 = 0;
  while ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_cur !=
         (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_start._M_cur) {
    iVar5 = todo_pop(this);
    pGVar1 = (this->super_Solver).game;
    piVar17 = pGVar1->_inedges + pGVar1->_firstins[iVar5];
    while( true ) {
      node = *piVar17;
      uVar19 = (ulong)node;
      if (uVar19 == 0xffffffffffffffff) break;
      if ((((this->super_Solver).disabled)->_bits[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) {
        bVar4 = lift(this,node,iVar5);
        if (bVar4) {
          todo_push(this,node);
        }
      }
      piVar17 = piVar17 + 1;
    }
    lVar3 = this->lift_count;
    if (((this->super_Solver).game)->n_vertices * 10 + lVar18 < lVar3) {
      update(this,0);
      update(this,1);
      lVar18 = lVar3;
    }
  }
  if (1 < (this->super_Solver).trace) {
    for (uVar19 = 0; (long)uVar19 < ((this->super_Solver).game)->n_vertices; uVar19 = uVar19 + 1) {
      if ((((this->super_Solver).disabled)->_bits[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) {
        poVar12 = std::operator<<((this->super_Solver).logger,"\x1b[35m**\x1b[m \x1b[1mnode ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar19);
        poVar12 = std::operator<<(poVar12,"/");
        poVar12 = (ostream *)
                  std::ostream::operator<<(poVar12,((this->super_Solver).game)->_priority[uVar19]);
        iVar5 = Solver::owner(&this->super_Solver,(int)uVar19);
        pcVar16 = " (odd)";
        if (iVar5 == 0) {
          pcVar16 = " (even)";
        }
        poVar12 = std::operator<<(poVar12,pcVar16);
        std::operator<<(poVar12,"\x1b[m is");
        pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar19);
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
      }
    }
  }
  uVar19 = 0;
  do {
    if (((this->super_Solver).game)->n_vertices <= (long)uVar19) {
      if (this->pms != (int *)0x0) {
        operator_delete__(this->pms);
      }
      if (this->strategy != (int *)0x0) {
        operator_delete__(this->strategy);
      }
      if (this->counts != (int *)0x0) {
        operator_delete__(this->counts);
      }
      if (this->tmp != (int *)0x0) {
        operator_delete__(this->tmp);
      }
      if (this->best != (int *)0x0) {
        operator_delete__(this->best);
      }
      if (this->dirty != (int *)0x0) {
        operator_delete__(this->dirty);
      }
      if (this->unstable != (int *)0x0) {
        operator_delete__(this->unstable);
      }
      poVar12 = std::operator<<((this->super_Solver).logger,"solved with ");
      poVar12 = std::ostream::_M_insert<long>((long)poVar12);
      poVar12 = std::operator<<(poVar12," lifts, ");
      poVar12 = std::ostream::_M_insert<long>((long)poVar12);
      poVar12 = std::operator<<(poVar12," lift attempts.");
      std::endl<char,std::char_traits<char>>(poVar12);
      return;
    }
    if ((((this->super_Solver).disabled)->_bits[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) {
      lVar18 = this->k * uVar19;
      iVar5 = this->pms[lVar18];
      if ((iVar5 == -1) != (this->pms[lVar18 + 1] != -1)) {
        this_00 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_00,"logic error",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/tspm.cpp"
                     ,0x1a1);
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      uVar6 = Solver::owner(&this->super_Solver,(int)uVar19);
      winner = (uint)(iVar5 != -1);
      iVar5 = -1;
      if (uVar6 == winner) {
        iVar5 = this->strategy[uVar19];
      }
      Solver::solve(&this->super_Solver,(int)uVar19,winner,iVar5);
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void
TSPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;
    if (k < 2) k = 2;

    // now create the data structure, for each node
    pms = new int[(size_t)k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    tmp = new int[k];
    best = new int[k];
    dirty = new int[nodecount()];
    unstable = new int[nodecount()];

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (disabled[i] == 0) counts[priority(i)]++;

    // initialize all nodes as not dirty
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue/stack to store the dirty vertices.
     */

    /**
     * Initialization loop.
     */

    for (int n=nodecount()-1; n>=0; n--) {
        if (!disabled[n] and lift(n, -1)) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
        }
    }
    
    /**
     * The main loop.
     */

    logger << "main loop now" << std::endl;
    int64_t last_update = 0;

    while (!todo.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (!disabled[from] and lift(from, n)) todo_push(from);
        }
        if (last_update + 10*nodecount() < lift_count) {
            last_update = lift_count;
            update(0);
            update(1);
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int n=0; n<nodecount(); n++) {
            if (disabled[n]) continue;
            logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            logger << std::endl;
        }
    }
#endif
    
    // Now set dominions and derive strategy for even.
    for (int n=0; n<nodecount(); n++) {
        if (disabled[n]) continue;
        int *pm = pms + k*n;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(n, winner, owner(n) == winner ? strategy[n] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] tmp;
    delete[] best;
    delete[] dirty;
    delete[] unstable;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}